

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.h
# Opt level: O0

uint32_t sysbvm_uint32_highBit(uint32_t word)

{
  uint uVar1;
  undefined4 local_10;
  uint32_t word_local;
  
  if (word == 0) {
    local_10 = 0;
  }
  else {
    uVar1 = 0x1f;
    if (word != 0) {
      for (; word >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    local_10 = 0x20 - (uVar1 ^ 0x1f);
  }
  return local_10;
}

Assistant:

SYSBVM_INLINE uint32_t sysbvm_uint32_highBit(uint32_t word)
{
#if defined(_MSC_VER)
    return 32 - __lzcnt(word);
#elif defined(__GNUC__)
    return word == 0 ? 0 : 32 - __builtin_clz(word);
#else
    uint32_t result = 0;
    while(word > 0)
    {
        ++result;
        word >>= 1;
    }

    return result;
#endif
}